

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<char_const*,short,unsigned_int>
               (IsoHPlane *node,char **in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
               vector<char,_std::allocator<char>_> *buffer2,bool diff_endian)

{
  bool bVar1;
  size_type sVar2;
  byte *pbVar3;
  reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  long in_RDI;
  vector<double,_std::allocator<double>_> *vec;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  size_t veclen;
  size_t ix;
  size_t data_sizets [10];
  double data_doubles [5];
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  value_type in_stack_ffffffffffffff24;
  reference in_stack_ffffffffffffff28;
  iterator in_stack_ffffffffffffff30;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  in_stack_ffffffffffffff38;
  vector<ColType,_std::allocator<ColType>_> *in_stack_ffffffffffffff40;
  size_type local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  ulong local_90;
  long local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (!interrupt_switch) {
    read_bytes<double,double>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    *(undefined8 *)(in_RDI + 0xc0) = local_58;
    *(undefined8 *)(in_RDI + 0xd8) = local_50;
    *(undefined8 *)(in_RDI + 0xe0) = local_48;
    *(undefined8 *)(in_RDI + 0xe8) = local_40;
    *(undefined8 *)(in_RDI + 0xf0) = local_38;
    read_bytes<unsigned_long,unsigned_int>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    *(undefined8 *)(in_RDI + 200) = local_a8;
    *(undefined8 *)(in_RDI + 0xd0) = local_a0;
    read_bytes<unsigned_long,unsigned_int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    if (local_90 != 0) {
      std::vector<ColType,_std::allocator<ColType>_>::resize
                (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38._M_current);
      std::vector<ColType,_std::allocator<ColType>_>::shrink_to_fit
                ((vector<ColType,_std::allocator<ColType>_> *)0x6691c6);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDX);
      if (sVar2 < local_90) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38._M_current);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x6691fc);
      read_bytes<unsigned_char>
                ((void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (size_t)in_stack_ffffffffffffff18,(char **)0x669211);
      for (local_b0 = 0; local_b0 < local_90; local_b0 = local_b0 + 1) {
        pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (in_RDX,local_b0);
        in_stack_ffffffffffffff24 = (value_type)*pbVar3;
        pvVar4 = std::vector<ColType,_std::allocator<ColType>_>::operator[]
                           ((vector<ColType,_std::allocator<ColType>_> *)(in_RDI + 0x18),local_b0);
        *pvVar4 = in_stack_ffffffffffffff24;
      }
    }
    read_bytes<double,double>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    read_bytes<double,double>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    if (local_78 != 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38._M_current);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::shrink_to_fit((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)0x669306);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff30 =
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_ffffffffffffff18);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                 *)in_stack_ffffffffffffff18), bVar1) {
        in_stack_ffffffffffffff28 =
             __gnu_cxx::
             __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator*((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)&stack0xffffffffffffff38);
        read_bytes<unsigned_long,unsigned_int>
                  (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
                   (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,false);
        read_bytes<double,double>
                  (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
                   (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff18,false);
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                      *)&stack0xffffffffffffff38);
      }
    }
    read_bytes<int,short>
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_current,
               (size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    read_bytes<double,double>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
    read_bytes<double,double>
              (in_stack_ffffffffffffff30._M_current,(size_t)in_stack_ffffffffffffff28,
               (char **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18,false);
  }
  return;
}

Assistant:

void deserialize_node(IsoHPlane &node, itype &in, std::vector<uint8_t> &buffer, std::vector<char> &buffer2, const bool diff_endian)
{
    if (interrupt_switch) return;

    double data_doubles[5];
    read_bytes<double, double>((void*)data_doubles, (size_t)5, in, buffer2, diff_endian);
    node.split_point = data_doubles[0];
    node.score = data_doubles[1];
    node.range_low = data_doubles[2];
    node.range_high = data_doubles[3];
    node.remainder = data_doubles[4];

    size_t data_sizets[10];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)10, in, buffer2, diff_endian);

    node.hplane_left = data_sizets[0];
    node.hplane_right = data_sizets[1];

    read_bytes<size_t, saved_size_t>(node.col_num, data_sizets[2], in, buffer2, diff_endian);

    if (data_sizets[3]) {
        node.col_type.resize(data_sizets[3]);
        node.col_type.shrink_to_fit();
        if (buffer.size() < data_sizets[3])
            buffer.resize((size_t)2 * data_sizets[3]);
        read_bytes<uint8_t>((void*)buffer.data(), data_sizets[3], in);
        for (size_t ix = 0; ix < data_sizets[3]; ix++)
            node.col_type[ix] = (ColType)buffer[ix];
    }

    read_bytes<double, double>(node.coef, data_sizets[4], in, buffer2, diff_endian);

    read_bytes<double, double>(node.mean, data_sizets[5], in, buffer2, diff_endian);

    if (data_sizets[6]) {
        node.cat_coef.resize(data_sizets[6]);
        node.cat_coef.shrink_to_fit();
        size_t veclen;
        for (auto &vec : node.cat_coef) {
            read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer2, diff_endian);
            read_bytes<double, double>(vec, veclen, in, buffer2, diff_endian);
        }
    }

    read_bytes<int, saved_int_t>(node.chosen_cat, data_sizets[7], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_val, data_sizets[8], in, buffer2, diff_endian);

    read_bytes<double, double>(node.fill_new, data_sizets[9], in, buffer2, diff_endian);
}